

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endian.h
# Opt level: O0

void store32(void *dst,uint32_t w)

{
  uint32_t w_local;
  void *dst_local;
  
  *(uint32_t *)dst = w;
  return;
}

Assistant:

static FORCE_INLINE void store32(void *dst, uint32_t w) {
#if defined(NATIVE_LITTLE_ENDIAN)
	memcpy(dst, &w, sizeof w);
#else
	uint8_t *p = (uint8_t *)dst;
	*p++ = (uint8_t)w;
	w >>= 8;
	*p++ = (uint8_t)w;
	w >>= 8;
	*p++ = (uint8_t)w;
	w >>= 8;
	*p++ = (uint8_t)w;
#endif
}